

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V2_Annotation::Read(ON_OBSOLETE_V2_Annotation *this,ON_BinaryArchive *file)

{
  V5_eAnnotationType VVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  int local_38;
  ON__INT32 local_34;
  int i_1;
  int i;
  uint ui;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_OBSOLETE_V2_Annotation *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Destroy(this);
  iStack_24 = 0;
  ui = 0;
  i._3_1_ = ON_BinaryArchive::Read3dmChunkVersion
                      (_minor_version,&stack0xffffffffffffffdc,(int *)&ui);
  if (((bool)i._3_1_) && (iStack_24 == 1)) {
    if ((bool)i._3_1_) {
      i_1 = 0;
      i._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__UINT32 *)&i_1);
      if ((bool)i._3_1_) {
        VVar1 = ON_INTERNAL_OBSOLETE::V5AnnotationTypeFromUnsigned(i_1);
        this->m_type = VVar1;
      }
    }
    if ((i._3_1_ & 1) != 0) {
      i._3_1_ = ON_BinaryArchive::ReadPlane(_minor_version,&this->m_plane);
    }
    if ((i._3_1_ & 1) != 0) {
      i._3_1_ = ON_BinaryArchive::ReadArray(_minor_version,&this->m_points);
    }
    if ((i._3_1_ & 1) != 0) {
      i._3_1_ = ON_BinaryArchive::ReadString(_minor_version,&this->m_usertext);
    }
    if ((i._3_1_ & 1) != 0) {
      i._3_1_ = ON_BinaryArchive::ReadString(_minor_version,&this->m_defaulttext);
    }
    if ((i._3_1_ & 1) != 0) {
      local_34 = 0;
      i._3_1_ = ON_BinaryArchive::ReadInt(_minor_version,&local_34);
      if ((bool)i._3_1_) {
        this->m_userpositionedtext = (bool)(-(local_34 != 0) & 1);
      }
    }
  }
  if (((1e+150 < ABS((this->m_plane).origin.x)) || (1e+150 < ABS((this->m_plane).origin.y))) ||
     (1e+150 < ABS((this->m_plane).origin.z))) {
    this_local._7_1_ = false;
  }
  else {
    for (local_38 = 0; iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&this->m_points), local_38 < iVar2;
        local_38 = local_38 + 1) {
      pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[](&this->m_points,local_38);
      if ((1e+150 < ABS(pOVar3->x)) ||
         (pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[](&this->m_points,local_38),
         1e+150 < ABS(pOVar3->y))) {
        return false;
      }
    }
    this_local._7_1_ = (bool)(i._3_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OBSOLETE_V2_Annotation::Read( ON_BinaryArchive& file )
{
  Destroy();
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    if (rc)
    {
      unsigned int ui = 0;
      rc = file.ReadInt( &ui );
      if (rc)
        m_type = ON_INTERNAL_OBSOLETE::V5AnnotationTypeFromUnsigned(ui);
    }
    if (rc)
      rc = file.ReadPlane( m_plane );
    if (rc)
      rc = file.ReadArray( m_points );
    if (rc)
      rc = file.ReadString( m_usertext );
    if (rc)
      rc = file.ReadString( m_defaulttext );
    if( rc )
    {
      int i = 0;
      rc = file.ReadInt( &i );
      if (rc)
        m_userpositionedtext = (i ? true : false);
    }
  }

  if( fabs( m_plane.origin.x) > REALLY_BIG_NUMBER || fabs( m_plane.origin.y) > REALLY_BIG_NUMBER || fabs( m_plane.origin.z) > REALLY_BIG_NUMBER)
    return false;

  for( int i = 0; i < m_points.Count(); i++)
  {
    if( fabs( m_points[i].x) > REALLY_BIG_NUMBER || fabs( m_points[i].y) > REALLY_BIG_NUMBER)
      return false;
  }


  return rc;
}